

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

SampledSpectrum __thiscall pbrt::DistantLight::Phi(DistantLight *this,SampledWavelengths *lambda)

{
  Float a;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar9 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined8 in_XMM1_Qb;
  SampledSpectrum SVar10;
  SampledSpectrum local_48;
  SampledSpectrum local_38;
  SampledSpectrum local_28;
  SampledSpectrum local_18;
  
  a = this->scale;
  auVar9 = (undefined1  [56])0x0;
  SVar10 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
  auVar5._0_8_ = SVar10.values.values._0_8_;
  auVar5._8_56_ = auVar9;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = SVar10.values.values._8_8_;
  local_48.values.values = (array<float,_4>)vmovlhps_avx(auVar5._0_16_,auVar1);
  auVar9 = (undefined1  [56])0x0;
  SVar10 = SampledSpectrum::operator*(&local_48,a);
  auVar6._0_8_ = SVar10.values.values._0_8_;
  auVar6._8_56_ = auVar9;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = SVar10.values.values._8_8_;
  local_38.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar2);
  auVar9 = (undefined1  [56])0x0;
  SVar10 = SampledSpectrum::operator*(&local_38,3.1415927);
  auVar7._0_8_ = SVar10.values.values._0_8_;
  auVar7._8_56_ = auVar9;
  auVar3._8_8_ = in_XMM1_Qb;
  auVar3._0_8_ = SVar10.values.values._8_8_;
  local_28.values.values = (array<float,_4>)vmovlhps_avx(auVar7._0_16_,auVar3);
  auVar9 = (undefined1  [56])0x0;
  SVar10 = SampledSpectrum::operator*(&local_28,this->sceneRadius);
  auVar8._0_8_ = SVar10.values.values._0_8_;
  auVar8._8_56_ = auVar9;
  auVar4._8_8_ = in_XMM1_Qb;
  auVar4._0_8_ = SVar10.values.values._8_8_;
  local_18.values.values = (array<float,_4>)vmovlhps_avx(auVar8._0_16_,auVar4);
  SVar10 = SampledSpectrum::operator*(&local_18,this->sceneRadius);
  return (array<float,_4>)(array<float,_4>)SVar10;
}

Assistant:

SampledSpectrum DistantLight::Phi(const SampledWavelengths &lambda) const {
    return scale * Lemit.Sample(lambda) * Pi * sceneRadius * sceneRadius;
}